

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O3

void bench_field_inverse_var(void *arg,int iters)

{
  bench_inv *data;
  
  if (0 < iters) {
    do {
      secp256k1_fe_impl_inv_var
                ((secp256k1_fe *)((long)arg + 0x40),(secp256k1_fe *)((long)arg + 0x40));
      *(long *)((long)arg + 0x40) = *(long *)((long)arg + 0x68) + *(long *)((long)arg + 0x40);
      *(long *)((long)arg + 0x48) = *(long *)((long)arg + 0x70) + *(long *)((long)arg + 0x48);
      *(long *)((long)arg + 0x50) = *(long *)((long)arg + 0x78) + *(long *)((long)arg + 0x50);
      *(long *)((long)arg + 0x58) = *(long *)((long)arg + 0x80) + *(long *)((long)arg + 0x58);
      *(long *)((long)arg + 0x60) = *(long *)((long)arg + 0x60) + *(long *)((long)arg + 0x88);
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

static void bench_field_inverse_var(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_fe_inv_var(&data->fe[0], &data->fe[0]);
        secp256k1_fe_add(&data->fe[0], &data->fe[1]);
    }
}